

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSerialAnalyzerSettings.cpp
# Opt level: O0

bool __thiscall
SimpleSerialAnalyzerSettings::SetSettingsFromInterfaces(SimpleSerialAnalyzerSettings *this)

{
  U32 UVar1;
  Channel local_20 [16];
  SimpleSerialAnalyzerSettings *local_10;
  SimpleSerialAnalyzerSettings *this_local;
  
  local_10 = this;
  AnalyzerSettingInterfaceChannel::GetChannel();
  Channel::operator=(&this->mInputChannel,local_20);
  Channel::~Channel(local_20);
  UVar1 = AnalyzerSettingInterfaceInteger::GetInteger();
  this->mBitRate = UVar1;
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mInputChannel,true);
  return true;
}

Assistant:

bool SimpleSerialAnalyzerSettings::SetSettingsFromInterfaces()
{
	mInputChannel = mInputChannelInterface.GetChannel();
	mBitRate = mBitRateInterface.GetInteger();

	ClearChannels();
	AddChannel( mInputChannel, "Simple Serial", true );

	return true;
}